

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask9_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 9 | *out;
  *out = in[2] << 0x12 | *out;
  *out = in[3] << 0x1b | *out;
  puVar1 = out + 1;
  *puVar1 = in[3] >> 5;
  *puVar1 = in[4] << 4 | *puVar1;
  *puVar1 = in[5] << 0xd | *puVar1;
  *puVar1 = in[6] << 0x16 | *puVar1;
  *puVar1 = in[7] << 0x1f | *puVar1;
  out[2] = in[7] >> 1;
  return out + 3;
}

Assistant:

uint32_t *__fastpackwithoutmask9_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (9 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (9 - 8);
  ++in;

  return out + 1;
}